

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.cpp
# Opt level: O0

bool isZSH(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  char *shell;
  allocator<char> local_31;
  size_type in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)getenv("SHELL");
  if (pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (pbVar1,in_stack_ffffffffffffffe8,(allocator<char> *)in_stack_ffffffffffffffe0);
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                       (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                        in_stack_ffffffffffffffd0);
    std::__cxx11::string::~string(pbVar1);
    std::allocator<char>::~allocator(&local_31);
    if (pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  0xffffffffffffffff) {
      return true;
    }
  }
  return false;
}

Assistant:

[[nodiscard]] static bool isZSH() {
  if (let *shell = std::getenv("SHELL"))
    if (std::string(shell).find("zsh") != std::string::npos)
      return true;

  return false;
}